

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O3

result<toml::detail::region,_toml::detail::none_t> *
toml::detail::
sequence<toml::detail::either<toml::detail::sequence<toml::detail::character<'\xe0'>,_toml::detail::in_range<'\xa0',_'\xbf'>_>,_toml::detail::sequence<toml::detail::in_range<'\xe1',_'\xec'>,_toml::detail::in_range<'\x80',_'\xbf'>_>,_toml::detail::sequence<toml::detail::character<'\xed'>,_toml::detail::in_range<'\x80',_'\x9f'>_>,_toml::detail::sequence<toml::detail::in_range<'\xee',_'\xef'>,_toml::detail::in_range<'\x80',_'\xbf'>_>_>,_toml::detail::in_range<'\x80',_'\xbf'>_>
::invoke(result<toml::detail::region,_toml::detail::none_t> *__return_storage_ptr__,location *loc)

{
  const_iterator rollback;
  pointer pcVar1;
  value_type *pvVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> in_R8;
  result<toml::detail::region,_toml::detail::none_t> rslt;
  undefined1 local_b8 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_88;
  const_iterator cStack_78;
  result<toml::detail::region,_toml::detail::none_t> local_70;
  
  rollback._M_current = (loc->iter_)._M_current;
  either<toml::detail::sequence<toml::detail::character<'\xe0'>,_toml::detail::in_range<'\xa0',_'\xbf'>_>,_toml::detail::sequence<toml::detail::in_range<'\xe1',_'\xec'>,_toml::detail::in_range<'\x80',_'\xbf'>_>,_toml::detail::sequence<toml::detail::character<'\xed'>,_toml::detail::in_range<'\x80',_'\x9f'>_>,_toml::detail::sequence<toml::detail::in_range<'\xee',_'\xef'>,_toml::detail::in_range<'\x80',_'\xbf'>_>_>
  ::invoke(&local_70,loc);
  if (local_70.is_ok_ == false) {
    location::reset(loc,rollback);
    __return_storage_ptr__->is_ok_ = false;
  }
  else {
    pvVar2 = result<toml::detail::region,_toml::detail::none_t>::unwrap(&local_70);
    local_b8._24_8_ = local_b8 + 0x28;
    local_b8._0_8_ = &PTR__region_001a47c0;
    local_b8._8_8_ =
         (pvVar2->source_).
         super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    local_b8._16_8_ =
         (pvVar2->source_).
         super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    (pvVar2->source_).
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (pvVar2->source_).
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    pcVar1 = (pvVar2->source_name_)._M_dataplus._M_p;
    paVar3 = &(pvVar2->source_name_).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 == paVar3) {
      local_b8._40_8_ = paVar3->_M_allocated_capacity;
      aStack_88._M_allocated_capacity = *(size_type *)((long)&(pvVar2->source_name_).field_2 + 8);
    }
    else {
      local_b8._40_8_ = paVar3->_M_allocated_capacity;
      local_b8._24_8_ = pcVar1;
    }
    local_b8._32_8_ = (pvVar2->source_name_)._M_string_length;
    (pvVar2->source_name_)._M_dataplus._M_p = (pointer)paVar3;
    (pvVar2->source_name_)._M_string_length = 0;
    (pvVar2->source_name_).field_2._M_local_buf[0] = '\0';
    aStack_88._8_8_ = (pvVar2->first_)._M_current;
    cStack_78._M_current = (pvVar2->last_)._M_current;
    sequence<toml::detail::in_range<(char)-128,(char)-65>>::
    invoke<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
              (__return_storage_ptr__,(sequence<toml::detail::in_range<(char)_128,(char)_65>> *)loc,
               (location *)local_b8,(region *)rollback._M_current,in_R8);
    region::~region((region *)local_b8);
  }
  if (local_70.is_ok_ == true) {
    region::~region(&local_70.field_1.succ.value);
  }
  return __return_storage_ptr__;
}

Assistant:

static result<region, none_t>
    invoke(location& loc)
    {
        const auto first = loc.iter();
        auto rslt = Head::invoke(loc);
        if(rslt.is_err())
        {
            loc.reset(first);
            return none();
        }
        return sequence<Tail...>::invoke(loc, std::move(rslt.unwrap()), first);
    }